

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::rm_srv_from_cluster(raft_server *this,int32 srv_id)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  element_type *peVar4;
  pointer pcVar5;
  ulong uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  undefined4 extraout_var;
  _Node *p_Var10;
  long lVar11;
  _Hash_node_base *p_Var12;
  ulong uVar13;
  __node_base_ptr p_Var14;
  __node_base_ptr p_Var15;
  undefined8 *puVar16;
  ptr<cluster_config> new_conf;
  ptr<cluster_config> cur_conf;
  ptr<peer> pp;
  ptr<log_entry> entry;
  ptr<buffer> new_conf_buf;
  log_val_type local_9a;
  undefined1 local_99;
  element_type *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  string local_88;
  undefined1 local_68 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  if ((this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    get_config((raft_server *)local_68);
    if ((this->uncommitted_config_).
        super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar3 != (element_type *)0x0) && (iVar9 = (*peVar3->_vptr_logger[7])(), 3 < iVar9)) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        peVar4 = (this->uncommitted_config_).
                 super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  (&local_88,"uncommitted config exists at log %lu, prev log %lu",peVar4->log_idx_,
                   peVar4->prev_log_idx_);
        (*peVar3->_vptr_logger[8])
                  (peVar3,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"rm_srv_from_cluster",0x1ee,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
      }
      local_68._0_8_ =
           (this->uncommitted_config_).
           super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8),
                 &(this->uncommitted_config_).
                  super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
    }
    iVar9 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_log_store[2])();
    uVar7 = *(undefined4 *)(ulong *)local_68._0_8_;
    uVar8 = *(undefined4 *)((long)(ulong *)local_68._0_8_ + 4);
    local_98 = (element_type *)0x0;
    local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
    (local_90._M_pi)->_M_use_count = 1;
    (local_90._M_pi)->_M_weak_count = 1;
    (local_90._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001817d8;
    local_98 = (element_type *)(local_90._M_pi + 1);
    local_90._M_pi[1]._vptr__Sp_counted_base = (_func_int **)CONCAT44(extraout_var,iVar9);
    local_90._M_pi[1]._M_use_count = uVar7;
    local_90._M_pi[1]._M_weak_count = uVar8;
    *(undefined1 *)&local_90._M_pi[2]._vptr__Sp_counted_base = 0;
    *(_Atomic_word **)&local_90._M_pi[2]._M_use_count = &local_90._M_pi[3]._M_use_count;
    local_90._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(undefined1 *)&local_90._M_pi[3]._M_use_count = 0;
    local_90._M_pi[4]._M_use_count = 0;
    local_90._M_pi[4]._M_weak_count = 0;
    local_90._M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
    local_90._M_pi[5]._vptr__Sp_counted_base = (_func_int **)&local_90._M_pi[4]._M_use_count;
    *(_Atomic_word **)&local_90._M_pi[4]._M_use_count = &local_90._M_pi[4]._M_use_count;
    local_90._M_pi[5]._M_use_count = 0;
    local_90._M_pi[5]._M_weak_count = 0;
    for (puVar16 = &((((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                        *)(local_68._0_8_ + 0x38))->
                     super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                     )._M_impl._M_node.super__List_node_base._M_next)->_M_next; peVar4 = local_98,
        (list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
         *)puVar16 !=
        (list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
         *)(local_68._0_8_ + 0x38); puVar16 = (undefined8 *)*puVar16) {
      if (*(int *)puVar16[2] != srv_id) {
        p_Var10 = std::__cxx11::
                  list<std::shared_ptr<nuraft::srv_config>,std::allocator<std::shared_ptr<nuraft::srv_config>>>
                  ::_M_create_node<std::shared_ptr<nuraft::srv_config>const&>
                            ((list<std::shared_ptr<nuraft::srv_config>,std::allocator<std::shared_ptr<nuraft::srv_config>>>
                              *)&local_98->servers_,(shared_ptr<nuraft::srv_config> *)(puVar16 + 2))
        ;
        std::__detail::_List_node_base::_M_hook(&p_Var10->super__List_node_base);
        psVar1 = &(peVar4->servers_).
                  super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
    }
    paVar2 = &local_88.field_2;
    pcVar5 = (((string *)(local_68._0_8_ + 0x18))->_M_dataplus)._M_p;
    local_88._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar5,
               pcVar5 + ((string *)(local_68._0_8_ + 0x18))->_M_string_length);
    std::__cxx11::string::_M_assign((string *)&peVar4->user_ctx_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    local_98->async_replication_ = *(bool *)(local_68._0_8_ + 0x10);
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3 != (element_type *)0x0) && (iVar9 = (*peVar3->_vptr_logger[7])(), 3 < iVar9)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_88,
                 "removed server %d from configuration and save the configuration to log store at %lu"
                 ,srv_id,local_98->log_idx_);
      (*peVar3->_vptr_logger[8])
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"rm_srv_from_cluster",0x203,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
    }
    this->config_changing_ = true;
    (this->uncommitted_config_).
    super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_98;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->uncommitted_config_).
                super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_90);
    cluster_config::serialize((cluster_config *)&stack0xffffffffffffffc8);
    local_88._M_dataplus._M_p =
         (pointer)(((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
    local_9a = conf;
    lVar11 = std::chrono::_V2::system_clock::now();
    local_68._16_8_ = lVar11 / 1000;
    local_68._32_8_ = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type,unsigned_long>
              (&local_40,(log_entry **)(local_68 + 0x20),(allocator<nuraft::log_entry> *)&local_99,
               (unsigned_long *)&local_88,(shared_ptr<nuraft::buffer> *)&stack0xffffffffffffffc8,
               &local_9a,(unsigned_long *)(local_68 + 0x10));
    store_log_entry(this,(ptr<log_entry> *)(local_68 + 0x20),0);
    uVar6 = (this->peers_)._M_h._M_bucket_count;
    uVar13 = (ulong)(long)srv_id % uVar6;
    p_Var14 = (this->peers_)._M_h._M_buckets[uVar13];
    p_Var15 = (__node_base_ptr)0x0;
    if ((p_Var14 != (__node_base_ptr)0x0) &&
       (p_Var12 = p_Var14->_M_nxt, p_Var15 = p_Var14, *(int *)&p_Var14->_M_nxt[1]._M_nxt != srv_id))
    {
      while (p_Var14 = p_Var12, p_Var12 = p_Var14->_M_nxt, p_Var12 != (_Hash_node_base *)0x0) {
        p_Var15 = (__node_base_ptr)0x0;
        if (((ulong)(long)*(int *)&p_Var12[1]._M_nxt % uVar6 != uVar13) ||
           (p_Var15 = p_Var14, *(int *)&p_Var12[1]._M_nxt == srv_id)) goto LAB_0013e9a4;
      }
      p_Var15 = (__node_base_ptr)0x0;
    }
LAB_0013e9a4:
    if (p_Var15 == (__node_base_ptr)0x0) {
      p_Var12 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var12 = p_Var15->_M_nxt;
    }
    if (p_Var12 != (_Hash_node_base *)0x0) {
      local_68._16_8_ = p_Var12[2]._M_nxt;
      local_68._24_8_ = p_Var12[3]._M_nxt;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_68._24_8_ + 8) = *(_Atomic_word *)(local_68._24_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_68._24_8_ + 8) = *(_Atomic_word *)(local_68._24_8_ + 8) + 1;
        }
      }
      (this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_68._16_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x18));
      this->srv_to_leave_target_idx_ = local_98->log_idx_;
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar3 != (element_type *)0x0) && (iVar9 = (*peVar3->_vptr_logger[7])(), 3 < iVar9)) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  (&local_88,"set srv_to_leave_, server %d will be removed from cluster, config %lu"
                   ,srv_id,this->srv_to_leave_target_idx_);
        (*peVar3->_vptr_logger[8])
                  (peVar3,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"rm_srv_from_cluster",0x215,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
      }
      if (local_68._24_8_ != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._24_8_);
      }
    }
    request_append_entries(this);
    if ((EventAwaiter *)local_40._M_pi != (EventAwaiter *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
    }
    if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
    }
    if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
    }
    if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
    }
  }
  else {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3 != (element_type *)0x0) && (iVar9 = (*peVar3->_vptr_logger[7])(), 2 < iVar9)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_88,"to-be-removed server %d already exists, cannot remove server %d for now"
                 ,(ulong)(uint)((((this->srv_to_leave_).
                                  super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->config_).
                                super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->id_,srv_id);
      (*peVar3->_vptr_logger[8])
                (peVar3,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"rm_srv_from_cluster",0x1e3,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void raft_server::rm_srv_from_cluster(int32 srv_id) {
    if (srv_to_leave_) {
        p_wn("to-be-removed server %d already exists, "
             "cannot remove server %d for now",
             srv_to_leave_->get_id(), srv_id);
        return;
    }

    ptr<cluster_config> cur_conf = get_config();

    // NOTE: Need to honor uncommitted config,
    //       refer to comment in `sync_log_to_new_srv()`
    if (uncommitted_config_) {
        p_in("uncommitted config exists at log %" PRIu64 ", prev log %" PRIu64,
             uncommitted_config_->get_log_idx(),
             uncommitted_config_->get_prev_log_idx());
        cur_conf = uncommitted_config_;
    }

    ptr<cluster_config> new_conf = cs_new<cluster_config>
                                   ( log_store_->next_slot(),
                                     cur_conf->get_log_idx() );
    for (auto it = cur_conf->get_servers().cbegin();
          it != cur_conf->get_servers().cend();
          ++it ) {
        if ((*it)->get_id() != srv_id) {
            new_conf->get_servers().push_back(*it);
        }
    }
    new_conf->set_user_ctx( cur_conf->get_user_ctx() );
    new_conf->set_async_replication
              ( cur_conf->is_async_replication() );

    p_in( "removed server %d from configuration and "
          "save the configuration to log store at %" PRIu64,
          srv_id,
          new_conf->get_log_idx() );

    config_changing_ = true;
    uncommitted_config_ = new_conf;
    ptr<buffer> new_conf_buf( new_conf->serialize() );
    ptr<log_entry> entry( cs_new<log_entry>( state_->get_term(),
                                             new_conf_buf,
                                             log_val_type::conf,
                                             timer_helper::get_timeofday_us() ) );
    store_log_entry(entry);

    auto p_entry = peers_.find(srv_id);
    if (p_entry != peers_.end()) {
        ptr<peer> pp = p_entry->second;
        srv_to_leave_ = pp;
        srv_to_leave_target_idx_ = new_conf->get_log_idx();
        p_in("set srv_to_leave_, "
             "server %d will be removed from cluster, config %" PRIu64,
             srv_id, srv_to_leave_target_idx_);
    }

    request_append_entries();
}